

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O3

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  byte bVar1;
  cs_detail *pcVar2;
  cs_insn *pcVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  x86_reg xVar8;
  ulong uVar9;
  uint8_t uVar10;
  undefined *puVar11;
  uint8_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  DisassemblerMode mode;
  long lVar15;
  OperandSpecifier *pOVar16;
  bool bVar17;
  InternalInstruction insn;
  uint8_t *local_a30;
  size_t local_a28;
  uint64_t local_a20;
  InternalInstruction local_a18;
  
  local_a30 = code;
  local_a28 = code_len;
  local_a20 = address;
  memset(&local_a18,0,0x938);
  pcVar2 = instr->flat_insn->detail;
  if (pcVar2 != (cs_detail *)0x0) {
    (pcVar2->field_6).x86.op_count = '\0';
    (instr->flat_insn->detail->field_6).x86.sse_cc = X86_SSE_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_cc = X86_AVX_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_sae = false;
    (instr->flat_insn->detail->field_6).x86.avx_rm = X86_AVX_RM_INVALID;
    (instr->flat_insn->detail->field_6).arm64.cc = ARM64_CC_INVALID;
    (instr->flat_insn->detail->field_6).arm.vector_size = 0;
    memset((void *)((long)&instr->flat_insn->detail->field_6 + 0x30),0,0x180);
  }
  mode = ((*(uint *)(ud + 4) & 4) == 0) + MODE_32BIT;
  if ((*(uint *)(ud + 4) & 2) != 0) {
    mode = MODE_16BIT;
  }
  iVar4 = decodeInstruction(&local_a18,reader,&local_a30,address,mode);
  if (iVar4 == 0) {
    *size = (uint16_t)local_a18.length;
    if (local_a18.spec != (InstructionSpecifier *)0x0) {
      MCInst_setOpcode(instr,(uint)local_a18.instructionID);
      if (local_a18.xAcquireRelease == true) {
        uVar5 = MCInst_getOpcode(instr);
        uVar6 = 0x186f;
        if (uVar5 != 0x943) {
          uVar5 = MCInst_getOpcode(instr);
          uVar6 = 0x1828;
          if (uVar5 != 0x93b) goto LAB_0019ee48;
        }
        MCInst_setOpcode(instr,uVar6);
      }
LAB_0019ee48:
      local_a18.numImmediatesTranslated = 0;
      lVar15 = 0;
      do {
        uVar10 = local_a18.operands[lVar15].encoding;
        if (uVar10 != '\0') {
          pOVar16 = local_a18.operands + lVar15;
LAB_0019ee78:
          switch(uVar10) {
          case '\x01':
            uVar14 = (ulong)local_a18.reg;
LAB_0019efae:
            puVar12 = &DAT_001ec140;
LAB_0019f6b4:
            uVar5 = (uint)puVar12[uVar14];
LAB_0019f6bb:
            MCOperand_CreateReg0(instr,uVar5);
            break;
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
            switch(pOVar16->type) {
            case '\b':
            case '\t':
            case '\n':
            case '\v':
            case '9':
            case ':':
            case ';':
            case '<':
            case '=':
            case '>':
            case '?':
            case '@':
            case 'A':
            case 'B':
            case 'E':
            case 'F':
            case 'K':
            case 'L':
            case 'N':
              if (local_a18.eaBase == EA_BASE_sib) {
                return false;
              }
              if (local_a18.eaBase == EA_BASE_sib64) {
                return false;
              }
              if (0xd2 < local_a18.eaBase - EA_REG_AL) {
                return false;
              }
              uVar5 = *(uint *)(&DAT_001eb6ec + (ulong)(local_a18.eaBase - EA_REG_AL) * 4);
              goto LAB_0019f6bb;
            default:
              return false;
            case '\x16':
            case '\x17':
            case '\x18':
            case '\x19':
            case '\x1a':
            case '\x1b':
            case '\x1c':
            case '\x1d':
            case '\x1e':
            case '\x1f':
            case ' ':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case 'M':
            case 'V':
              switch(local_a18.eaBase) {
              case EA_BASE_NONE:
                if (local_a18.eaDisplacement == EA_DISP_NONE) {
                  return false;
                }
                if (local_a18.mode == MODE_64BIT) {
                  if (local_a18.prefix3 == 'g') {
                    uVar5 = 0x1a;
                  }
                  else {
                    uVar5 = 0x29;
                  }
                  break;
                }
                uVar5 = 0;
                MCOperand_CreateReg0(instr,0);
                uVar14 = 1;
                goto LAB_0019f684;
              case EA_BASE_BX_SI:
                uVar5 = 8;
                goto LAB_0019f57c;
              case EA_BASE_BX_DI:
                uVar5 = 8;
                goto LAB_0019f4f8;
              case EA_BASE_BP_SI:
                uVar5 = 6;
LAB_0019f57c:
                MCOperand_CreateReg0(instr,uVar5);
                uVar14 = 1;
                uVar5 = 0x2d;
                goto LAB_0019f684;
              case EA_BASE_BP_DI:
                uVar5 = 6;
LAB_0019f4f8:
                MCOperand_CreateReg0(instr,uVar5);
                uVar14 = 1;
                uVar5 = 0xe;
                goto LAB_0019f684;
              case EA_BASE_SI:
                uVar5 = 0x2d;
                break;
              case EA_BASE_DI:
                uVar5 = 0xe;
                break;
              case EA_BASE_BP:
                uVar5 = 6;
                break;
              case EA_BASE_BX:
                uVar5 = 8;
                break;
              case EA_BASE_R8W:
                uVar5 = 0xe2;
                break;
              case EA_BASE_R9W:
                uVar5 = 0xe3;
                break;
              case EA_BASE_R10W:
                uVar5 = 0xe4;
                break;
              case EA_BASE_R11W:
                uVar5 = 0xe5;
                break;
              case EA_BASE_R12W:
                uVar5 = 0xe6;
                break;
              case EA_BASE_R13W:
                uVar5 = 0xe7;
                break;
              case EA_BASE_R14W:
                uVar5 = 0xe8;
                break;
              case EA_BASE_R15W:
                uVar5 = 0xe9;
                break;
              case EA_BASE_EAX:
                uVar5 = 0x13;
                break;
              case EA_BASE_ECX:
                uVar5 = 0x16;
                break;
              case EA_BASE_EDX:
                uVar5 = 0x18;
                break;
              case EA_BASE_EBX:
                uVar5 = 0x15;
                break;
              case EA_BASE_sib:
              case EA_BASE_sib64:
                if (0x20 < (ulong)local_a18.sibBase) {
                  return false;
                }
                MCOperand_CreateReg0(instr,*(uint *)(&DAT_001eba38 + (ulong)local_a18.sibBase * 4));
                uVar5 = MCInst_getOpcode(instr);
                if (((uVar5 - 0xeea < 0x14) && ((0xfc03fU >> (uVar5 - 0xeea & 0x1f) & 1) != 0)) ||
                   (uVar5 - 0x13e2 < 0xc)) {
                  iVar4 = 0x71;
                  if (((0xe < uVar5 - 0xeee) || ((0x4801U >> (uVar5 - 0xeee & 0x1f) & 1) == 0)) &&
                     ((9 < uVar5 - 0x13e3 || ((0x241U >> (uVar5 - 0x13e3 & 0x1f) & 1) == 0)))) {
                    iVar4 = (uint)(((uVar5 == 0x13e8 || uVar5 == 0x13eb) ||
                                   (uVar5 & 0xfffffffb) == 0x13e2) ||
                                  ((uVar5 == 0xef8 || uVar5 == 0xeed) ||
                                  (uVar5 & 0xffffffef) == 0xeeb)) * 0x20 + 0x31;
                  }
                  iVar7 = 4;
                  if (local_a18.sibIndex != SIB_INDEX_NONE) {
                    iVar7 = (uint)(local_a18.addressSize != '\b') * 0x10 + local_a18.sibIndex +
                            -0x21;
                  }
                  local_a18.sibIndex = iVar7 + iVar4;
                }
                if (local_a18.sibIndex == SIB_INDEX_NONE) {
                  uVar5 = 0;
                }
                else {
                  if (0x7f < local_a18.sibIndex - SIB_INDEX_EAX) {
                    return false;
                  }
                  uVar5 = *(uint *)(&DAT_001ebabc + (ulong)(local_a18.sibIndex - SIB_INDEX_EAX) * 4)
                  ;
                }
                uVar14 = (ulong)local_a18.sibScale;
                goto LAB_0019f684;
              case EA_BASE_EBP:
                uVar5 = 0x14;
                break;
              case EA_BASE_ESI:
                uVar5 = 0x1d;
                break;
              case EA_BASE_EDI:
                uVar5 = 0x17;
                break;
              case EA_BASE_R8D:
                uVar5 = 0xda;
                break;
              case EA_BASE_R9D:
                uVar5 = 0xdb;
                break;
              case EA_BASE_R10D:
                uVar5 = 0xdc;
                break;
              case EA_BASE_R11D:
                uVar5 = 0xdd;
                break;
              case EA_BASE_R12D:
                uVar5 = 0xde;
                break;
              case EA_BASE_R13D:
                uVar5 = 0xdf;
                break;
              case EA_BASE_R14D:
                uVar5 = 0xe0;
                break;
              case EA_BASE_R15D:
                uVar5 = 0xe1;
                break;
              case EA_BASE_RAX:
                uVar5 = 0x23;
                break;
              case EA_BASE_RCX:
                uVar5 = 0x26;
                break;
              case EA_BASE_RDX:
                uVar5 = 0x28;
                break;
              case EA_BASE_RBX:
                uVar5 = 0x25;
                break;
              case EA_BASE_RBP:
                uVar5 = 0x24;
                break;
              case EA_BASE_RSI:
                uVar5 = 0x2b;
                break;
              case EA_BASE_RDI:
                uVar5 = 0x27;
                break;
              case EA_BASE_R8:
                uVar5 = 0x62;
                break;
              case EA_BASE_R9:
                uVar5 = 99;
                break;
              case EA_BASE_R10:
                uVar5 = 100;
                break;
              case EA_BASE_R11:
                uVar5 = 0x65;
                break;
              case EA_BASE_R12:
                uVar5 = 0x66;
                break;
              case EA_BASE_R13:
                uVar5 = 0x67;
                break;
              case EA_BASE_R14:
                uVar5 = 0x68;
                break;
              case EA_BASE_R15:
                uVar5 = 0x69;
                break;
              default:
                goto switchD_0019eebf_caseD_c;
              }
              MCOperand_CreateReg0(instr,uVar5);
              uVar14 = 1;
              uVar5 = 0;
LAB_0019f684:
              MCOperand_CreateImm0(instr,uVar14);
              MCOperand_CreateReg0(instr,uVar5);
              MCOperand_CreateImm0(instr,(long)local_a18.displacement);
LAB_0019f6a6:
              uVar14 = (ulong)local_a18.segmentOverride;
              puVar12 = "";
            }
            goto LAB_0019f6b4;
          case '\t':
            uVar14 = (ulong)local_a18.vvvv;
            goto LAB_0019efae;
          case '\n':
            if ((local_a18.writemask & (MODRM_REG_DR6|MODRM_REG_RSP)) != MODRM_REG_AL) {
              return false;
            }
            uVar5 = local_a18.writemask + MODRM_REG_XMM6 & 0x5f;
            goto LAB_0019f6bb;
          default:
            goto switchD_0019eebf_caseD_c;
          case '\x11':
          case '\x12':
          case '\x13':
          case '\x14':
          case '\x1a':
          case '\x1b':
            uVar14 = (ulong)local_a18.numImmediatesTranslated;
            local_a18.numImmediatesTranslated = local_a18.numImmediatesTranslated + 1;
            uVar14 = local_a18.immediates[uVar14];
            bVar1 = pOVar16->type;
            if (bVar1 < 0x10) {
              if (bVar1 - 0xc < 4) {
LAB_0019ef30:
                uVar5 = MCInst_getOpcode(instr);
                uVar10 = pOVar16->encoding;
                if (uVar10 == '\x13') {
                  uVar9 = uVar14 | 0xffffffff00000000;
                  bVar17 = (int)uVar14 < 0;
LAB_0019f1ee:
                  if (bVar17) {
                    uVar14 = uVar9;
                  }
                }
                else {
                  if (uVar10 == '\x12') {
                    uVar9 = uVar14 | 0xffffffffffff0000;
                    bVar17 = (short)uVar14 < 0;
                    goto LAB_0019f1ee;
                  }
                  if ((uVar10 == '\x11') && ((uVar5 & 0xfffffffb) - 0xbe3 < 0xfffffffe)) {
                    if ((int)uVar5 < 0x79d) {
                      if ((int)uVar5 < 0x2da) {
                        if (((uVar5 != 0xfc) && (uVar5 != 0xfe)) && (uVar5 != 0x2d8))
                        goto LAB_0019f6e8;
                      }
                      else if ((int)uVar5 < 0x395) {
                        if ((uVar5 != 0x2da) && (uVar5 != 0x390)) goto LAB_0019f6e8;
                      }
                      else if ((uVar5 != 0x395) && (uVar5 != 0x6df)) goto LAB_0019f6e8;
                    }
                    else if ((int)uVar5 < 0xf1b) {
                      if ((2 < uVar5 - 0xcf9) && (uVar5 != 0x79d)) {
LAB_0019f6e8:
                        uVar9 = uVar14 | 0xffffffffffffff00;
                        bVar17 = (char)uVar14 < '\0';
                        goto LAB_0019f1ee;
                      }
                    }
                    else if (((uVar5 != 0xf1b) && (uVar5 != 0x1181)) && (uVar5 != 0x1268))
                    goto LAB_0019f6e8;
                  }
                }
LAB_0019f1f2:
                uVar5 = (uint)uVar14;
                if (bVar1 < 0x3d) {
                  if (bVar1 - 3 < 2) {
                    uVar6 = 0x80000000;
                    uVar9 = 0xffffffff00000000;
                  }
                  else {
                    if (bVar1 != 1) goto LAB_0019f2e0;
                    uVar9 = 0xffffffffffffff00;
                    uVar6 = 0x80;
                  }
                  uVar13 = 0;
                  if ((uVar6 & uVar5) != 0) {
                    uVar13 = uVar9;
                  }
                  uVar14 = uVar13 | uVar14;
                  goto LAB_0019f3a6;
                }
                if (bVar1 - 0x3d < 3) {
                  uVar5 = (uVar5 >> 4) + 0x72;
                  goto LAB_0019f6bb;
                }
                if (bVar1 == 0x40) {
                  uVar5 = (uVar5 >> 4) + 0x92;
                  goto LAB_0019f6bb;
                }
                if (bVar1 != 0x41) {
LAB_0019f2e0:
                  MCOperand_CreateImm0(instr,uVar14);
                  if ((byte)(bVar1 - 0x2d) < 4) goto LAB_0019f6a6;
                  break;
                }
                uVar5 = (uVar5 >> 4) + 0xb2;
                goto LAB_0019f6bb;
              }
LAB_0019f277:
              if ((uVar14 < 0x20) || (bVar1 != 0x11)) goto LAB_0019f1f2;
              uVar6 = MCInst_getOpcode(instr);
              uVar6 = uVar6 - 0xc01;
              uVar5 = 0;
              if (uVar6 < 0x29) {
                puVar11 = &DAT_001ebd04;
LAB_0019f2a8:
                uVar5 = *(uint *)(puVar11 + (ulong)uVar6 * 4);
              }
LAB_0019f2ab:
              MCInst_setOpcode(instr,uVar5);
            }
            else if (bVar1 == 0x10) {
              if (7 < uVar14) {
                uVar6 = MCInst_getOpcode(instr);
                uVar6 = uVar6 - 0x226;
                uVar5 = 0;
                if (uVar6 < 0x12) {
                  puVar11 = &DAT_001ebcbc;
                  goto LAB_0019f2a8;
                }
                goto LAB_0019f2ab;
              }
            }
            else {
              if (bVar1 == 0x4f) goto LAB_0019ef30;
              if (bVar1 != 0x50) goto LAB_0019f277;
              if (local_a18.displacementSize == '\x04') {
                uVar9 = uVar14 | 0xffffffff00000000;
                bVar17 = (int)uVar14 < 0;
              }
              else if (local_a18.displacementSize == '\x02') {
                uVar9 = uVar14 | 0xffffffffffff0000;
                bVar17 = (short)uVar14 < 0;
              }
              else {
                if (local_a18.displacementSize != '\x01') goto LAB_0019f3a6;
                uVar9 = uVar14 | 0xffffffffffffff00;
                bVar17 = (char)uVar14 < '\0';
              }
              if (bVar17) {
                uVar14 = uVar9;
              }
            }
LAB_0019f3a6:
            MCOperand_CreateImm0(instr,uVar14);
            break;
          case '\x15':
          case '\x16':
          case '\x17':
          case '\x18':
          case '\x1c':
            uVar14 = (ulong)local_a18.opcodeRegister;
            goto LAB_0019efae;
          case '\x19':
            uVar5 = (local_a18.modRM & 7) + 0x6a;
            goto LAB_0019f6bb;
          case '\x1d':
            goto switchD_0019ee8e_caseD_1d;
          case '\x1e':
            if (local_a18.mode == MODE_32BIT) {
              bVar17 = local_a18.prefixPresent[0x67] != '\0';
LAB_0019f326:
              uVar5 = (uint)bVar17 * 0x10 + 0x1d;
            }
            else {
              if (local_a18.mode != MODE_64BIT) {
                bVar17 = local_a18.prefixPresent[0x67] == '\0';
                goto LAB_0019f326;
              }
              uVar5 = 0x1d;
              if (local_a18.prefixPresent[0x67] == '\0') {
                uVar5 = 0x2b;
              }
            }
            MCOperand_CreateReg0(instr,uVar5);
            goto LAB_0019f6a6;
          case '\x1f':
            if (local_a18.mode == MODE_32BIT) {
              bVar17 = local_a18.prefixPresent[0x67] == '\0';
            }
            else {
              if (local_a18.mode == MODE_64BIT) {
                uVar5 = (uint)(local_a18.prefixPresent[0x67] == '\0') * 0x10 + 0x17;
                goto LAB_0019f6bb;
              }
              bVar17 = local_a18.prefixPresent[0x67] != '\0';
            }
            uVar5 = (uint)bVar17 * 9 + 0xe;
            goto LAB_0019f6bb;
          }
        }
        lVar15 = lVar15 + 1;
        if (lVar15 == 5) {
          instr->imm_size = local_a18.immSize;
          if (*(int *)(ud + 0xe0) == 0) {
            instr->x86_prefix[0] = local_a18.prefix0;
            instr->x86_prefix[1] = local_a18.prefix1;
            instr->x86_prefix[2] = local_a18.prefix2;
            instr->x86_prefix[3] = local_a18.prefix3;
          }
          else {
            pcVar3 = instr->flat_insn;
            instr->x86_prefix[0] = local_a18.prefix0;
            instr->x86_prefix[1] = local_a18.prefix1;
            instr->x86_prefix[2] = local_a18.prefix2;
            instr->x86_prefix[3] = local_a18.prefix3;
            if (local_a18.vectorExtensionType == TYPE_NO_VEX_XOP) {
              if (local_a18.twoByteEscape == '\0') {
                (pcVar3->detail->field_6).x86.opcode[0] = local_a18.opcode;
              }
              else {
                (pcVar3->detail->field_6).x86.opcode[0] = local_a18.twoByteEscape;
                if (local_a18.threeByteEscape == '\0') {
                  (pcVar3->detail->field_6).x86.opcode[1] = local_a18.opcode;
                }
                else {
                  (pcVar3->detail->field_6).x86.opcode[1] = local_a18.threeByteEscape;
                  (pcVar3->detail->field_6).x86.opcode[2] = local_a18.opcode;
                }
              }
            }
            else {
              (pcVar3->detail->field_6).arm.vector_size = (int)local_a18.vectorExtensionPrefix;
            }
            (pcVar3->detail->field_6).x86.rex = local_a18.rexPrefix;
            (pcVar3->detail->field_6).x86.addr_size = local_a18.addressSize;
            (pcVar3->detail->field_6).x86.modrm = local_a18.orgModRM;
            (pcVar3->detail->field_6).x86.sib = local_a18.sib;
            (pcVar3->detail->field_6).x86.disp = local_a18.displacement;
            xVar8 = x86_map_sib_index(local_a18.sibIndex);
            (pcVar3->detail->field_6).x86.sib_index = xVar8;
            (pcVar3->detail->field_6).x86.sib_scale = local_a18.sibScale;
            xVar8 = x86_map_sib_base(local_a18.sibBase);
            (pcVar3->detail->field_6).x86.sib_base = xVar8;
          }
          return true;
        }
      } while( true );
    }
  }
  else {
    *size = (short)local_a18.readerCursor - (short)address;
  }
switchD_0019eebf_caseD_c:
  return false;
switchD_0019ee8e_caseD_1d:
  pOVar16 = local_a18.operands + ((ulong)pOVar16->type - 0x51);
  uVar10 = pOVar16->encoding;
  goto LAB_0019ee78;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn;
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	memset(&insn, 0, offsetof(InternalInstruction, reader));

	if (instr->flat_insn->detail) {
		instr->flat_insn->detail->x86.op_count = 0;
		instr->flat_insn->detail->x86.sse_cc = X86_SSE_CC_INVALID;
		instr->flat_insn->detail->x86.avx_cc = X86_AVX_CC_INVALID;
		instr->flat_insn->detail->x86.avx_sae = false;
		instr->flat_insn->detail->x86.avx_rm = X86_AVX_RM_INVALID;

		memset(instr->flat_insn->detail->x86.prefix, 0, sizeof(instr->flat_insn->detail->x86.prefix));
		memset(instr->flat_insn->detail->x86.opcode, 0, sizeof(instr->flat_insn->detail->x86.opcode));
		memset(instr->flat_insn->detail->x86.operands, 0, sizeof(instr->flat_insn->detail->x86.operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}